

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,int index)

{
  Value *pVVar1;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  int index_local;
  Value *this_local;
  
  if (index < 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,
                    "in Json::Value::operator[](int index) const: index cannot be negative");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  }
  pVVar1 = operator[](this,index);
  return pVVar1;
}

Assistant:

const Value& Value::operator[](int index) const {
  JSON_ASSERT_MESSAGE(
      index >= 0,
      "in Json::Value::operator[](int index) const: index cannot be negative");
  return (*this)[ArrayIndex(index)];
}